

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Teleport_NoFog(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  bool bVar1;
  uint local_2c;
  int flags;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  local_2c = 0;
  switch(arg1) {
  case 0:
    local_2c = 4;
    break;
  default:
    break;
  case 2:
    if (ln != (line_t *)0x0) {
      local_2c = 0x24;
    }
    break;
  case 3:
    if (ln != (line_t *)0x0) {
      local_2c = 0x44;
    }
  }
  if (arg3 != 0) {
    local_2c = local_2c | 0x10;
  }
  bVar1 = EV_Teleport(arg0,arg2,ln,(uint)backSide,it,local_2c);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Teleport_NoFog)
// Teleport_NoFog (tid, useang, sectortag, keepheight)
{
	int flags = 0;
	switch (arg1)
	{
	case 0:
		flags |= TELF_KEEPORIENTATION;
		break;

	default:
	case 1:
		break;

	case 2:
		if (ln != NULL) flags |= TELF_KEEPORIENTATION | TELF_ROTATEBOOM;	// adjust to exit thing like Boom (i.e. with incorrect reversed angle)
		break;

	case 3:
		if (ln != NULL) flags |= TELF_KEEPORIENTATION | TELF_ROTATEBOOMINVERSE;	// adjust to exit thing correctly
		break;
	}

	if (arg3)
	{
		flags |= TELF_KEEPHEIGHT;
	}
	return EV_Teleport (arg0, arg2, ln, backSide, it, flags);
}